

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

uECC_word_t
uECC_vli_sub(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  uECC_word_t uVar1;
  int iVar2;
  undefined7 in_register_00000009;
  long lVar3;
  ulong uVar4;
  
  lVar3 = 0;
  iVar2 = (int)CONCAT71(in_register_00000009,num_words);
  if (num_words < '\x01') {
    iVar2 = 0;
  }
  uVar1 = 0;
  for (; iVar2 != lVar3; lVar3 = lVar3 + 1) {
    uVar4 = right[lVar3] + uVar1;
    if (uVar4 != 0) {
      uVar1 = (ulong)(left[lVar3] < uVar4);
    }
    result[lVar3] = left[lVar3] - uVar4;
  }
  return uVar1;
}

Assistant:

uECC_VLI_API uECC_word_t uECC_vli_sub(uECC_word_t *result,
                                      const uECC_word_t *left,
                                      const uECC_word_t *right,
                                      wordcount_t num_words) {
    uECC_word_t borrow = 0;
    wordcount_t i;
    for (i = 0; i < num_words; ++i) {
        uECC_word_t diff = left[i] - right[i] - borrow;
        if (diff != left[i]) {
            borrow = (diff > left[i]);
        }
        result[i] = diff;
    }
    return borrow;
}